

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::writePlotFileDoit(Amr *this,string *pltfile,bool regular)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode __a;
  pointer pAVar3;
  char *pcVar4;
  char *pcVar5;
  streamsize sVar6;
  int *piVar7;
  byte in_DL;
  string *in_RSI;
  long in_RDI;
  double dPlotFileTime;
  int IOProc;
  int k_3;
  int k_2;
  int k_1;
  int k;
  int old_prec;
  ofstream HeaderFile;
  IO_Buffer io_buffer;
  string HeaderFileName;
  int i;
  string pltfileTemp;
  StreamRetry sretry;
  Version currentVersion;
  double dPlotFileTime0;
  allocator *in_stack_fffffffffffff878;
  Print *in_stack_fffffffffffff880;
  undefined7 in_stack_fffffffffffff890;
  undefined1 in_stack_fffffffffffff897;
  Print *in_stack_fffffffffffff8a0;
  Print *in_stack_fffffffffffff8a8;
  Print *in_stack_fffffffffffff8b0;
  Print *in_stack_fffffffffffff8b8;
  Print *in_stack_fffffffffffff8f0;
  allocator local_6b9;
  string local_6b8;
  allocator local_691;
  string local_690;
  int local_66c;
  undefined1 in_stack_fffffffffffffacf;
  string *in_stack_fffffffffffffad0;
  StreamRetry *in_stack_fffffffffffffad8;
  double local_358;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  long local_338 [64];
  allocator<char> local_131 [25];
  string local_118 [39];
  allocator local_f1;
  string local_f0;
  int local_d0;
  string local_c0 [140];
  Version local_34;
  double local_30;
  byte local_21;
  string *local_20;
  char *local_10;
  char *local_8;
  
  local_21 = in_DL & 1;
  local_20 = in_RSI;
  local_30 = second();
  ParallelDescriptor::Communicator();
  VisMF::SetNOutFiles((int)((ulong)in_stack_fffffffffffff880 >> 0x20),
                      (MPI_Comm)in_stack_fffffffffffff880);
  local_34 = VisMF::GetHeaderVersion();
  VisMF::SetHeaderVersion((anonymous_namespace)::plot_headerversion);
  StreamRetry::StreamRetry
            ((StreamRetry *)in_stack_fffffffffffff8b0,(string *)in_stack_fffffffffffff8a8,
             SUB81((ulong)in_stack_fffffffffffff8a0 >> 0x38,0),(int)in_stack_fffffffffffff8a0);
  bVar1 = AsyncOut::UseAsyncOut();
  if (bVar1) {
    std::__cxx11::string::string(local_c0,local_20);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8a8,(char *)in_stack_fffffffffffff8a0);
  }
  do {
    bVar1 = StreamRetry::TryFileOutput(in_stack_fffffffffffffad8);
    if (!bVar1) break;
    if (((anonymous_namespace)::precreateDirectories & 1) == 0) {
      UtilRenameDirectoryToOld(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
      UtilCreateCleanDirectory(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
    }
    else {
      UtilRenameDirectoryToOld(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
      UtilCreateCleanDirectory(in_stack_fffffffffffffad0,(bool)in_stack_fffffffffffffacf);
      for (local_d0 = 0; local_d0 <= *(int *)(in_RDI + 0x94); local_d0 = local_d0 + 1) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff880,(size_type)in_stack_fffffffffffff878);
        pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x1381fb9);
        (*pAVar3->_vptr_AmrLevel[2])(pAVar3,local_c0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,"Amr::writePlotFile:PCD",&local_f1);
      ParallelDescriptor::Barrier(&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8a8,(char *)in_stack_fffffffffffff8a0);
    VisMFBuffer::GetIOBufferSize();
    std::allocator<char>::allocator();
    Vector<char,_std::allocator<char>_>::vector
              ((Vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff880,
               (size_type)in_stack_fffffffffffff878,(allocator_type *)0x1382143);
    std::allocator<char>::~allocator(local_131);
    std::ofstream::ofstream(local_338);
    pcVar4 = (char *)std::ofstream::rdbuf();
    pcVar5 = Vector<char,_std::allocator<char>_>::dataPtr
                       ((Vector<char,_std::allocator<char>_> *)0x138218d);
    Vector<char,_std::allocator<char>_>::size((Vector<char,_std::allocator<char>_> *)0x13821a2);
    std::streambuf::pubsetbuf(pcVar4,(long)pcVar5);
    local_33c = 0;
    bVar1 = ParallelDescriptor::IOProcessor();
    if (bVar1) {
      in_stack_fffffffffffff8f0 = (Print *)std::__cxx11::string::c_str();
      __a = std::operator|(_S_out,_S_trunc);
      std::operator|(__a,_S_bin);
      std::ofstream::open((char *)local_338,(_Ios_Openmode)in_stack_fffffffffffff8f0);
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) {
        FileOpenFailed((string *)in_stack_fffffffffffff8b8);
      }
      sVar6 = std::ios_base::precision
                        ((ios_base *)((long)local_338 + *(long *)(local_338[0] + -0x18)),0xf);
      local_33c = (int)sVar6;
    }
    if ((local_21 & 1) == 0) {
      for (local_34c = 0; local_34c <= *(int *)(in_RDI + 0x94); local_34c = local_34c + 1) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff880,(size_type)in_stack_fffffffffffff878);
        pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x13824d7);
        (*pAVar3->_vptr_AmrLevel[7])(pAVar3,local_c0,local_338,1);
      }
    }
    else {
      for (local_340 = 0; local_340 <= *(int *)(in_RDI + 0x94); local_340 = local_340 + 1) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff880,(size_type)in_stack_fffffffffffff878);
        pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x1382362);
        (*pAVar3->_vptr_AmrLevel[5])(pAVar3,local_c0,local_338);
      }
      for (local_344 = 0; local_344 <= *(int *)(in_RDI + 0x94); local_344 = local_344 + 1) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff880,(size_type)in_stack_fffffffffffff878);
        pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x13823db);
        (*pAVar3->_vptr_AmrLevel[4])(pAVar3,local_c0,local_338,1);
      }
      for (local_348 = 0; local_348 <= *(int *)(in_RDI + 0x94); local_348 = local_348 + 1) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)in_stack_fffffffffffff880,(size_type)in_stack_fffffffffffff878);
        pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x1382459);
        (*pAVar3->_vptr_AmrLevel[6])(pAVar3,local_c0,local_338);
      }
    }
    bVar1 = ParallelDescriptor::IOProcessor();
    if (bVar1) {
      std::ios_base::precision
                ((ios_base *)((long)local_338 + *(long *)(local_338[0] + -0x18)),(long)local_33c);
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) {
        if ((local_21 & 1) == 0) {
          local_10 = "Amr::writeSmallPlotFile() failed";
          Error_host((char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890));
        }
        else {
          local_8 = "Amr::writePlotFile() failed";
          Error_host((char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890));
        }
      }
    }
    if ((local_21 & 1) == 0) {
      piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                          (size_type)in_stack_fffffffffffff878);
      *(int *)(in_RDI + 0x23c) = *piVar7;
    }
    else {
      piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                          (size_type)in_stack_fffffffffffff878);
      *(int *)(in_RDI + 0x238) = *piVar7;
    }
    if (0 < *(int *)(in_RDI + 8)) {
      local_350 = ParallelDescriptor::IOProcessorNumber();
      local_358 = second();
      local_358 = local_358 - local_30;
      ParallelDescriptor::ReduceRealMax<double>(&local_358,local_350);
      if ((local_21 & 1) == 0) {
        in_stack_fffffffffffff8b0 = (Print *)OutStream();
        Print::Print(in_stack_fffffffffffff8b0,(ostream *)in_stack_fffffffffffff8a8);
        in_stack_fffffffffffff8a8 =
             Print::operator<<(in_stack_fffffffffffff880,(char (*) [29])in_stack_fffffffffffff878);
        in_stack_fffffffffffff8a0 =
             Print::operator<<(in_stack_fffffffffffff880,(double *)in_stack_fffffffffffff878);
        Print::operator<<(in_stack_fffffffffffff880,(char (*) [10])in_stack_fffffffffffff878);
        Print::operator<<(in_stack_fffffffffffff880,(char (*) [3])in_stack_fffffffffffff878);
        Print::~Print(in_stack_fffffffffffff8f0);
      }
      else {
        OutStream();
        Print::Print(in_stack_fffffffffffff8b0,(ostream *)in_stack_fffffffffffff8a8);
        Print::operator<<(in_stack_fffffffffffff880,(char (*) [23])in_stack_fffffffffffff878);
        Print::operator<<(in_stack_fffffffffffff880,(double *)in_stack_fffffffffffff878);
        in_stack_fffffffffffff8b8 =
             Print::operator<<(in_stack_fffffffffffff880,(char (*) [10])in_stack_fffffffffffff878);
        Print::operator<<(in_stack_fffffffffffff880,(char (*) [3])in_stack_fffffffffffff878);
        Print::~Print(in_stack_fffffffffffff8f0);
      }
    }
    in_stack_fffffffffffff897 = AsyncOut::UseAsyncOut();
    if ((bool)in_stack_fffffffffffff897) {
      local_66c = 3;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_690,"Amr::writePlotFile::end",&local_691);
      ParallelDescriptor::Barrier(&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      std::allocator<char>::~allocator((allocator<char> *)&local_691);
      bVar1 = ParallelDescriptor::IOProcessor();
      if (bVar1) {
        std::ofstream::close();
        in_stack_fffffffffffff880 = (Print *)std::__cxx11::string::c_str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        rename((char *)in_stack_fffffffffffff880,pcVar4);
      }
      in_stack_fffffffffffff878 = &local_6b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_6b8,"Renaming temporary plotfile.",in_stack_fffffffffffff878);
      ParallelDescriptor::Barrier(&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
      local_66c = 0;
    }
    std::ofstream::~ofstream(local_338);
    Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0x13829b9);
    std::__cxx11::string::~string(local_118);
  } while (local_66c == 0);
  VisMF::SetHeaderVersion(local_34);
  std::__cxx11::string::~string(local_c0);
  StreamRetry::~StreamRetry((StreamRetry *)in_stack_fffffffffffff880);
  return;
}

Assistant:

void
Amr::writePlotFileDoit (std::string const& pltfile, bool regular)
{
    auto dPlotFileTime0 = amrex::second();

    VisMF::SetNOutFiles(plot_nfiles);
    VisMF::Header::Version currentVersion(VisMF::GetHeaderVersion());
    VisMF::SetHeaderVersion(plot_headerversion);

    amrex::StreamRetry sretry(pltfile, abort_on_stream_retry_failure,
                              stream_max_tries);

    const std::string pltfileTemp = (AsyncOut::UseAsyncOut()) ? pltfile : (pltfile + ".temp");

    while(sretry.TryFileOutput()) {
        //
        //  if either the pltfile or pltfileTemp exists, rename them
        //  to move them out of the way.  then create pltfile
        //  with the temporary name, then rename it back when
        //  it is finished writing.  then stream retry can rename
        //  it to a bad suffix if there were stream errors.
        //

        if (precreateDirectories) {    // ---- make all directories at once
            amrex::UtilRenameDirectoryToOld(pltfile, false);      // dont call barrier
            amrex::UtilCreateCleanDirectory(pltfileTemp, false);  // dont call barrier
            for(int i(0); i <= finest_level; ++i) {
                amr_level[i]->CreateLevelDirectory(pltfileTemp);
            }
            ParallelDescriptor::Barrier("Amr::writePlotFile:PCD");
        } else {
            amrex::UtilRenameDirectoryToOld(pltfile, false);     // dont call barrier
            amrex::UtilCreateCleanDirectory(pltfileTemp, true);  // call barrier
        }

        std::string HeaderFileName(pltfileTemp + "/Header");

        VisMF::IO_Buffer io_buffer(VisMF::GetIOBufferSize());

        std::ofstream HeaderFile;

        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());

        int old_prec(0);

        if (ParallelDescriptor::IOProcessor()) {
            //
            // Only the IOProcessor() writes to the header file.
            //
            HeaderFile.open(HeaderFileName.c_str(), std::ios::out | std::ios::trunc |
                            std::ios::binary);
            if ( ! HeaderFile.good()) {
                amrex::FileOpenFailed(HeaderFileName);
            }
            old_prec = HeaderFile.precision(15);
        }

        if (regular) {
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFilePre(pltfileTemp, HeaderFile);
            }
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFile(pltfileTemp, HeaderFile);
            }
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFilePost(pltfileTemp, HeaderFile);
            }
        } else {
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writeSmallPlotFile(pltfileTemp, HeaderFile);
            }
        }

        if (ParallelDescriptor::IOProcessor()) {
            HeaderFile.precision(old_prec);
            if ( ! HeaderFile.good()) {
                if (regular) {
                    amrex::Error("Amr::writePlotFile() failed");
                } else {
                    amrex::Error("Amr::writeSmallPlotFile() failed");
                }
            }
        }

        if (regular) {
            last_plotfile = level_steps[0];
        } else {
            last_smallplotfile = level_steps[0];
        }

        if (verbose > 0) {
            const int IOProc        = ParallelDescriptor::IOProcessorNumber();
            auto      dPlotFileTime = amrex::second() - dPlotFileTime0;
            ParallelDescriptor::ReduceRealMax(dPlotFileTime,IOProc);
            if (regular) {
                amrex::Print() << "Write plotfile time = " << dPlotFileTime << "  seconds" << "\n\n";
            } else {
                amrex::Print() << "Write small plotfile time = " << dPlotFileTime << "  seconds" << "\n\n";
            }
        }

        if (AsyncOut::UseAsyncOut()) {
            break;
        } else {
            ParallelDescriptor::Barrier("Amr::writePlotFile::end");
            if(ParallelDescriptor::IOProcessor()) {
                HeaderFile.close();
                std::rename(pltfileTemp.c_str(), pltfile.c_str());
            }
            ParallelDescriptor::Barrier("Renaming temporary plotfile.");
            //
            // the plotfile file now has the regular name
            //
        }
    }  // end while

    VisMF::SetHeaderVersion(currentVersion);
}